

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall TPZMatrix<TPZFlopCounter>::Decompose_LU(TPZMatrix<TPZFlopCounter> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  TPZFlopCounter nn;
  double local_68;
  long local_60;
  double local_58;
  double local_50;
  double local_48;
  
  if (1 < (byte)(this->super_TPZBaseMatrix).fDecomposed) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
  }
  if ((this->super_TPZBaseMatrix).fDecomposed == '\0') {
    local_60 = (this->super_TPZBaseMatrix).fRow;
    lVar3 = (this->super_TPZBaseMatrix).fCol;
    if (lVar3 < local_60) {
      local_60 = lVar3;
    }
    if (0 < local_60) {
      lVar3 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar3,lVar3);
        local_48 = extraout_XMM0_Qa;
        if (ABS(extraout_XMM0_Qa) < 1e-12) {
          Error("Decompose_LU <matrix is singular>",(char *)0x0);
        }
        lVar1 = lVar3 + 1;
        lVar2 = lVar1;
        if (lVar1 < (this->super_TPZBaseMatrix).fRow) {
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar2,lVar3)
            ;
            TPZFlopCounter::gCount.fCount[2] = TPZFlopCounter::gCount.fCount[2] + 1;
            local_68 = extraout_XMM0_Qa_00 / local_48;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar2,lVar3,&local_68);
            lVar4 = lVar1;
            if (lVar1 < (this->super_TPZBaseMatrix).fCol) {
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar2,lVar4);
                local_58 = extraout_XMM0_Qa_01;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar3,lVar4);
                local_50 = local_58 - extraout_XMM0_Qa_02 * local_68;
                TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
                TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,lVar2,lVar4,&local_50);
                lVar4 = lVar4 + 1;
              } while (lVar4 < (this->super_TPZBaseMatrix).fCol);
            }
            lVar2 = lVar2 + 1;
          } while (lVar2 < (this->super_TPZBaseMatrix).fRow);
        }
        lVar3 = lVar1;
      } while (lVar1 != local_60);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}